

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BothInclusiveBetweenOperator,true,false,true>
                (hugeint_t *adata,hugeint_t *bdata,hugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  hugeint_t upper;
  hugeint_t input;
  hugeint_t lower;
  bool bVar1;
  int64_t unaff_RBX;
  uint64_t uVar2;
  uint64_t unaff_R12;
  int64_t unaff_R13;
  idx_t i;
  uint64_t uVar3;
  long lVar4;
  
  lVar4 = 0;
  for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = uVar3;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar2 = (uint64_t)result_sel->sel_vector[uVar3];
    }
    input.upper = unaff_RBX;
    input.lower = (uint64_t)asel;
    lower.upper = unaff_R13;
    lower.lower = unaff_R12;
    upper.upper = (int64_t)result_sel;
    upper.lower = count;
    bVar1 = BothInclusiveBetweenOperator::Operation<duckdb::hugeint_t>(input,lower,upper);
    false_sel->sel_vector[lVar4] = (sel_t)uVar2;
    lVar4 = lVar4 + (ulong)!bVar1;
  }
  return count - lVar4;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}